

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O1

Bool handle_compress(bz_stream *strm)

{
  uint *puVar1;
  byte bVar2;
  int iVar3;
  EState *s;
  bool bVar4;
  bool bVar5;
  bz_stream *pbVar6;
  UChar ch;
  int iVar7;
  uint uVar8;
  bool is_last_block;
  
  s = (EState *)strm->state;
  bVar4 = false;
  bVar5 = false;
LAB_004a5813:
  do {
    do {
      if (s->state == 1) {
        pbVar6 = s->strm;
        if ((pbVar6->avail_out == 0) || (iVar7 = s->state_out_pos, s->numZ <= iVar7)) {
          bVar2 = 0;
        }
        else {
          do {
            *pbVar6->next_out = s->zbits[iVar7];
            s->state_out_pos = s->state_out_pos + 1;
            pbVar6 = s->strm;
            uVar8 = pbVar6->avail_out - 1;
            pbVar6->avail_out = uVar8;
            pbVar6->next_out = pbVar6->next_out + 1;
            puVar1 = &pbVar6->total_out_lo32;
            *puVar1 = *puVar1 + 1;
            if (*puVar1 == 0) {
              pbVar6->total_out_hi32 = pbVar6->total_out_hi32 + 1;
            }
            bVar2 = 1;
          } while ((uVar8 != 0) && (iVar7 = s->state_out_pos, iVar7 < s->numZ));
        }
        bVar4 = (bool)(bVar4 | bVar2);
        if ((s->state_out_pos < s->numZ) ||
           (((iVar7 = s->mode, iVar7 == 4 && (s->avail_in_expect == 0)) &&
            ((0xff < s->state_in_ch || (s->state_in_len < 1)))))) goto LAB_004a5aff;
        s->nblock = 0;
        s->numZ = 0;
        s->state_out_pos = 0;
        s->blockCRC = 0xffffffff;
        memset(s->inUse,0,0x100);
        s->blockNo = s->blockNo + 1;
        s->state = 2;
        if (((iVar7 == 3) && (s->avail_in_expect == 0)) &&
           ((0xff < s->state_in_ch || (s->state_in_len < 1)))) goto LAB_004a5aff;
      }
    } while (s->state != 2);
    if (s->mode == 2) {
      iVar7 = s->nblock;
      if ((iVar7 < s->nblockMAX) && (pbVar6 = s->strm, pbVar6->avail_in != 0)) {
        do {
          bVar2 = *pbVar6->next_in;
          uVar8 = s->state_in_ch;
          iVar3 = s->state_in_len;
          if (uVar8 == bVar2) {
            if (iVar3 == 0xff) {
LAB_004a5982:
              if (uVar8 < 0x100) {
                add_pair_to_block(s);
              }
              s->state_in_ch = (uint)bVar2;
              s->state_in_len = 1;
            }
            else {
              s->state_in_len = iVar3 + 1;
            }
          }
          else {
            if (iVar3 != 1) goto LAB_004a5982;
            s->blockCRC = s->blockCRC << 8 ^ BZ2_crc32Table[uVar8 & 0xff ^ s->blockCRC >> 0x18];
            s->inUse[uVar8] = '\x01';
            s->block[iVar7] = (UChar)uVar8;
            s->nblock = s->nblock + 1;
            s->state_in_ch = (uint)bVar2;
          }
          pbVar6 = s->strm;
          pbVar6->next_in = pbVar6->next_in + 1;
          pbVar6->avail_in = pbVar6->avail_in - 1;
          puVar1 = &pbVar6->total_in_lo32;
          *puVar1 = *puVar1 + 1;
          if (*puVar1 == 0) {
            pbVar6->total_in_hi32 = pbVar6->total_in_hi32 + 1;
          }
          iVar7 = s->nblock;
          bVar2 = 1;
        } while ((iVar7 < s->nblockMAX) && (pbVar6 = s->strm, pbVar6->avail_in != 0));
      }
      else {
LAB_004a5a9c:
        bVar2 = 0;
      }
    }
    else {
      iVar7 = s->nblock;
      if (((s->nblockMAX <= iVar7) || (pbVar6 = s->strm, pbVar6->avail_in == 0)) ||
         (s->avail_in_expect == 0)) goto LAB_004a5a9c;
      do {
        bVar2 = *pbVar6->next_in;
        uVar8 = s->state_in_ch;
        iVar3 = s->state_in_len;
        if (uVar8 == bVar2) {
          if (iVar3 == 0xff) {
LAB_004a5a4e:
            if (uVar8 < 0x100) {
              add_pair_to_block(s);
            }
            s->state_in_ch = (uint)bVar2;
            s->state_in_len = 1;
          }
          else {
            s->state_in_len = iVar3 + 1;
          }
        }
        else {
          if (iVar3 != 1) goto LAB_004a5a4e;
          s->blockCRC = s->blockCRC << 8 ^ BZ2_crc32Table[uVar8 & 0xff ^ s->blockCRC >> 0x18];
          s->inUse[uVar8] = '\x01';
          s->block[iVar7] = (UChar)uVar8;
          s->nblock = s->nblock + 1;
          s->state_in_ch = (uint)bVar2;
        }
        pbVar6 = s->strm;
        pbVar6->next_in = pbVar6->next_in + 1;
        pbVar6->avail_in = pbVar6->avail_in - 1;
        puVar1 = &pbVar6->total_in_lo32;
        *puVar1 = *puVar1 + 1;
        if (*puVar1 == 0) {
          pbVar6->total_in_hi32 = pbVar6->total_in_hi32 + 1;
        }
        s->avail_in_expect = s->avail_in_expect - 1;
        iVar7 = s->nblock;
        bVar2 = 1;
      } while (((iVar7 < s->nblockMAX) && (pbVar6 = s->strm, pbVar6->avail_in != 0)) &&
              (s->avail_in_expect != 0));
    }
    bVar5 = (bool)(bVar5 | bVar2);
    if ((s->mode == 2) || (s->avail_in_expect != 0)) break;
    if (s->state_in_ch < 0x100) {
      add_pair_to_block(s);
    }
    s->state_in_ch = 0x100;
    s->state_in_len = 0;
    is_last_block = s->mode == 4;
LAB_004a5ae8:
    BZ2_compressBlock(s,is_last_block);
    s->state = 1;
  } while( true );
  if (s->nblockMAX <= s->nblock) {
    is_last_block = false;
    goto LAB_004a5ae8;
  }
  if (s->strm->avail_in == 0) {
LAB_004a5aff:
    return bVar4 || bVar5;
  }
  goto LAB_004a5813;
}

Assistant:

static
Bool handle_compress ( bz_stream* strm )
{
   Bool progress_in  = False;
   Bool progress_out = False;
   EState* s = (EState *)strm->state;
   
   while (True) {

      if (s->state == BZ_S_OUTPUT) {
         progress_out |= copy_output_until_stop ( s );
         if (s->state_out_pos < s->numZ) break;
         if (s->mode == BZ_M_FINISHING && 
             s->avail_in_expect == 0 &&
             isempty_RL(s)) break;
         prepare_new_block ( s );
         s->state = BZ_S_INPUT;
         if (s->mode == BZ_M_FLUSHING && 
             s->avail_in_expect == 0 &&
             isempty_RL(s)) break;
      }

      if (s->state == BZ_S_INPUT) {
         progress_in |= copy_input_until_stop ( s );
         if (s->mode != BZ_M_RUNNING && s->avail_in_expect == 0) {
            flush_RL ( s );
            BZ2_compressBlock ( s, (Bool)(s->mode == BZ_M_FINISHING) );
            s->state = BZ_S_OUTPUT;
         }
         else
         if (s->nblock >= s->nblockMAX) {
            BZ2_compressBlock ( s, False );
            s->state = BZ_S_OUTPUT;
         }
         else
         if (s->strm->avail_in == 0) {
            break;
         }
      }

   }

   return progress_in || progress_out;
}